

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.cpp
# Opt level: O0

void stk::Stk::handleError(string *message,Type type)

{
  ostream *poVar1;
  StkError *this;
  Type type_local;
  string *message_local;
  
  if ((type == WARNING) || (type == STATUS)) {
    if ((showWarnings_ & 1) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,'\n');
      poVar1 = std::operator<<(poVar1,(string *)message);
      poVar1 = std::operator<<(poVar1,'\n');
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  else if (type != DEBUG_PRINT) {
    if ((printErrors_ & 1) != 0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,'\n');
      poVar1 = std::operator<<(poVar1,(string *)message);
      poVar1 = std::operator<<(poVar1,'\n');
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    this = (StkError *)__cxa_allocate_exception(0x30);
    StkError::StkError(this,message,type);
    __cxa_throw(this,&StkError::typeinfo,StkError::~StkError);
  }
  return;
}

Assistant:

void Stk :: handleError( std::string message, StkError::Type type )
{
  if ( type == StkError::WARNING || type == StkError::STATUS ) {
    if ( !showWarnings_ ) return;
    std::cerr << '\n' << message << '\n' << std::endl;
  }
  else if (type == StkError::DEBUG_PRINT) {
#if defined(_STK_DEBUG_)
    std::cerr << '\n' << message << '\n' << std::endl;
#endif
  }
  else {
    if ( printErrors_ ) {
      // Print error message before throwing.
      std::cerr << '\n' << message << '\n' << std::endl;
    }
    throw StkError(message, type);
  }
}